

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

level_info_t * __thiscall
FMapInfoParser::ParseMapHeader(FMapInfoParser *this,level_info_t *defaultinfo)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  level_info_t *this_00;
  FString *other;
  FString *song;
  level_info_t *levelinfo;
  int levelindex;
  char maptemp [8];
  FName mapname;
  level_info_t *defaultinfo_local;
  FMapInfoParser *this_local;
  
  unique0x10000312 = defaultinfo;
  FName::FName((FName *)maptemp);
  bVar1 = FScanner::CheckNumber(&this->sc);
  if (bVar1) {
    mysnprintf((char *)((long)&levelinfo + 4),8,"MAP%02d",(ulong)(uint)(this->sc).Number);
    FName::operator=((FName *)maptemp,(char *)((long)&levelinfo + 4));
    this->HexenHack = true;
  }
  else {
    FScanner::MustGetString(&this->sc);
    FName::operator=((FName *)maptemp,(this->sc).String);
  }
  pcVar3 = FName::operator_cast_to_char_((FName *)maptemp);
  levelinfo._0_4_ = FindWadLevelInfo(pcVar3);
  if ((uint)levelinfo == 0xffffffff) {
    levelinfo._0_4_ = TArray<level_info_t,_level_info_t>::Reserve(&wadlevelinfos,1);
  }
  this_00 = TArray<level_info_t,_level_info_t>::operator[]
                      (&wadlevelinfos,(long)(int)(uint)levelinfo);
  level_info_t::operator=(this_00,stack0xffffffffffffffe8);
  if ((this->HexenHack & 1U) != 0) {
    this_00->WallVertLight = '\0';
    this_00->WallHorizLight = '\0';
    this_00->flags = this_00->flags | 0x81801;
    this_00->flags2 = this_00->flags2 | 0x810110;
  }
  pcVar3 = FName::operator_cast_to_char_((FName *)maptemp);
  FString::operator=(&this_00->MapName,pcVar3);
  FString::ToUpper(&this_00->MapName);
  FScanner::MustGetString(&this->sc);
  if (*(this->sc).String == '$') {
    this_00->flags = this_00->flags | 0x4000000;
    FString::operator=(&this_00->LevelName,(this->sc).String + 1);
  }
  else {
    bVar1 = FScanner::Compare(&this->sc,"lookup");
    if (bVar1) {
      FScanner::MustGetString(&this->sc);
      this_00->flags = this_00->flags | 0x4000000;
    }
    FString::operator=(&this_00->LevelName,(this->sc).String);
  }
  pcVar3 = FString::operator_cast_to_char_(&this_00->MapName);
  iVar2 = GetDefaultLevelNum(pcVar3);
  this_00->levelnum = iVar2;
  other = TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::CheckKey
                    (&HexenMusic,this_00->levelnum);
  if (other != (FString *)0x0) {
    FString::operator=(&this_00->Music,other);
  }
  return this_00;
}

Assistant:

level_info_t *FMapInfoParser::ParseMapHeader(level_info_t &defaultinfo)
{
	FName mapname;

	if (sc.CheckNumber())
	{	// MAPNAME is a number; assume a Hexen wad
		char maptemp[8];
		mysnprintf (maptemp, countof(maptemp), "MAP%02d", sc.Number);
		mapname = maptemp;
		HexenHack = true;
	}
	else 
	{
		sc.MustGetString();
		mapname = sc.String;
	}
	int levelindex = FindWadLevelInfo (mapname);
	if (levelindex == -1)
	{
		levelindex = wadlevelinfos.Reserve(1);
	}
	level_info_t *levelinfo = &wadlevelinfos[levelindex];
	*levelinfo = defaultinfo;
	if (HexenHack)
	{
		levelinfo->WallHorizLight = levelinfo->WallVertLight = 0;

		// Hexen levels are automatically nointermission,
		// no auto sound sequences, falling damage,
		// monsters activate their own specials, and missiles
		// are always the activators of impact lines.
		levelinfo->flags |= LEVEL_NOINTERMISSION
						 | LEVEL_SNDSEQTOTALCTRL
						 | LEVEL_FALLDMG_HX
						 | LEVEL_ACTOWNSPECIAL;
		levelinfo->flags2|= LEVEL2_HEXENHACK
						 | LEVEL2_INFINITE_FLIGHT
						 | LEVEL2_MISSILESACTIVATEIMPACT
						 | LEVEL2_MONSTERFALLINGDAMAGE;

	}

	levelinfo->MapName = mapname;
	levelinfo->MapName.ToUpper();
	sc.MustGetString ();
	if (sc.String[0] == '$')
	{
		// For consistency with other definitions allow $Stringtablename here, too.
		levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		levelinfo->LevelName = sc.String + 1;
	}
	else
	{
		if (sc.Compare ("lookup"))
		{
			sc.MustGetString ();
			levelinfo->flags |= LEVEL_LOOKUPLEVELNAME;
		}
		levelinfo->LevelName = sc.String;
	}

	// Set up levelnum now so that you can use Teleport_NewMap specials
	// to teleport to maps with standard names without needing a levelnum.
	levelinfo->levelnum = GetDefaultLevelNum(levelinfo->MapName);

	// Does this map have a song defined via SNDINFO's $map command?
	// Set that as this map's default music if it does.
	FString *song;
	if ((song = HexenMusic.CheckKey(levelinfo->levelnum)) != NULL)
	{
		levelinfo->Music = *song;
	}

	return levelinfo;
}